

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

int __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::set_layer_pattern
          (DatarateTestSVC *this,int frame_cnt,aom_svc_layer_id_t *layer_id,
          aom_svc_ref_frame_config_t *ref_frame_config,
          aom_svc_ref_frame_comp_pred_t *ref_frame_comp_pred,int spatial_layer,int multi_ref,
          int comp_pred,int is_key_frame,int dynamic_enable_disable_mode,int rps_mode,
          int rps_recovery_frame,int simulcast_mode,bool use_last_as_scaled,
          bool use_last_as_scaled_single_ref)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  aom_svc_ref_frame_config_t *paVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar16;
  
  layer_id->spatial_layer_id = spatial_layer;
  piVar1 = ref_frame_config->ref_idx;
  ref_frame_config->reference[3] = 0;
  ref_frame_config->reference[4] = 0;
  ref_frame_config->reference[5] = 0;
  ref_frame_config->reference[6] = 0;
  ref_frame_config->reference[0] = 0;
  ref_frame_config->reference[1] = 0;
  ref_frame_config->reference[2] = 0;
  auVar2 = _DAT_00c30d80;
  ref_frame_config->reference[3] = 0;
  lVar9 = 0;
  auVar12 = _DAT_00c40100;
  do {
    if (SUB164(auVar12 ^ auVar2,4) == -0x80000000 && SUB164(auVar12 ^ auVar2,0) < -0x7ffffff9) {
      ref_frame_config->ref_idx[lVar9] = (int)lVar9;
      ref_frame_config->ref_idx[lVar9 + 1] = (int)lVar9 + 1;
    }
    lVar9 = lVar9 + 2;
    lVar6 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 2;
    auVar12._8_8_ = lVar6 + 2;
  } while (lVar9 != 8);
  ref_frame_config->refresh[4] = 0;
  ref_frame_config->refresh[5] = 0;
  ref_frame_config->refresh[6] = 0;
  ref_frame_config->refresh[7] = 0;
  ref_frame_config->refresh[0] = 0;
  ref_frame_config->refresh[1] = 0;
  ref_frame_config->refresh[2] = 0;
  ref_frame_config->refresh[3] = 0;
  if (comp_pred != 0) {
    ref_frame_comp_pred->use_comp_pred[0] = 1;
    ref_frame_comp_pred->use_comp_pred[1] = 1;
    ref_frame_comp_pred->use_comp_pred[2] = 1;
  }
  ref_frame_config->reference[0] = 1;
  if ((this->number_temporal_layers_ == 1) && (this->number_spatial_layers_ == 1)) {
    layer_id->temporal_layer_id = 0;
    ref_frame_config->refresh[0] = 1;
    if (rps_mode != 0) {
      uVar3 = frame_cnt - 1U & 7;
      if (frame_cnt < 2) {
        uVar3 = 0;
      }
      uVar8 = 0;
      if (8 < frame_cnt) {
        uVar8 = frame_cnt & 7U;
      }
      lVar9 = 10;
      auVar13 = _DAT_00c400f0;
      auVar17 = _DAT_00c40100;
      do {
        if (SUB164(auVar17 ^ auVar2,4) == -0x80000000 && SUB164(auVar17 ^ auVar2,0) < -0x7ffffff9) {
          ref_frame_config->reference[lVar9 + -3] = uVar3;
          ref_frame_config->reference[lVar9 + -2] = uVar3;
        }
        if (SUB164(auVar13 ^ auVar2,4) == -0x80000000 && SUB164(auVar13 ^ auVar2,0) < -0x7ffffff9) {
          ref_frame_config->reference[lVar9 + -1] = uVar3;
          ref_frame_config->reference[lVar9] = uVar3;
        }
        lVar6 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar6 + 4;
        lVar6 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar6 + 4;
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x12);
      iVar11 = 0;
      uVar10 = frame_cnt & 7U ^ 4;
      if (frame_cnt < 5) {
        uVar10 = 0;
      }
      ref_frame_config->ref_idx[0] = uVar3;
      ref_frame_config->ref_idx[1] = frame_cnt % 8;
      ref_frame_config->ref_idx[3] = uVar8;
      ref_frame_config->ref_idx[6] = uVar10;
      iVar7 = 1;
      ref_frame_config->refresh[frame_cnt % 8] = 1;
      ref_frame_config->reference[0] = 1;
      ref_frame_config->reference[6] = 1;
      ref_frame_config->reference[3] = 1;
      if (frame_cnt != rps_recovery_frame) {
        if (rps_recovery_frame + 8 <= frame_cnt || frame_cnt <= rps_recovery_frame)
        goto LAB_00625158;
        iVar7 = 0;
        iVar11 = 1;
      }
      ref_frame_config->reference[0] = iVar11;
      ref_frame_config->reference[6] = 0;
      ref_frame_config->reference[3] = iVar7;
    }
LAB_00625158:
    if (this->intra_only_single_layer_ != 0) {
      ref_frame_config->ref_idx[0] = 0;
      ref_frame_config->ref_idx[3] = 1;
      ref_frame_config->ref_idx[6] = 2;
      if (frame_cnt == 1) {
        ref_frame_config->reference[3] = 0;
        ref_frame_config->reference[4] = 0;
        ref_frame_config->reference[5] = 0;
        ref_frame_config->reference[6] = 0;
        ref_frame_config->reference[0] = 0;
        ref_frame_config->reference[1] = 0;
        ref_frame_config->reference[2] = 0;
        ref_frame_config->reference[3] = 0;
      }
    }
  }
  uVar3 = this->number_temporal_layers_;
  uVar8 = this->number_spatial_layers_;
  if (uVar3 == 2 && (uVar8 ^ 1) == 0) {
    uVar3 = frame_cnt >> 1;
    ref_frame_config->ref_idx[3] = 3;
    if ((int)uVar3 < 1) {
      uVar3 = 5;
    }
    else if ((frame_cnt & 1U) == 0) {
      uVar3 = uVar3 % 3 + 5;
    }
    else {
      uVar3 = (uVar3 + 1) % 3 + 5;
    }
    ref_frame_config->ref_idx[6] = uVar3;
    if ((frame_cnt & 1U) == 0) {
      layer_id->temporal_layer_id = 0;
      ref_frame_config->refresh[0] = 1;
      ref_frame_config->reference[0] = 1;
      ref_frame_config->refresh[uVar3] = 1;
      if ((frame_cnt & 0x3eU) == 0) {
        paVar5 = (aom_svc_ref_frame_config_t *)(ref_frame_config->refresh + 3);
        goto LAB_006252b7;
      }
    }
    else {
      layer_id->temporal_layer_id = 1;
      paVar5 = ref_frame_config;
LAB_006252b7:
      paVar5->reference[0] = 1;
    }
    if (layer_id->temporal_layer_id != 0) goto LAB_006254e6;
  }
  else {
    iVar11 = frame_cnt >> 2;
    if ((uVar8 ^ 1) != 0 || (uVar3 ^ 3) != 0) {
      if (uVar8 == 2 && (uVar3 ^ 1) == 0) {
        layer_id->temporal_layer_id = 0;
        if (layer_id->spatial_layer_id == 0) {
          lVar9 = 0x38;
          iVar7 = 3;
          iVar11 = 0;
LAB_006254cc:
          ref_frame_config->ref_idx[0] = iVar11;
          ref_frame_config->ref_idx[3] = iVar7;
          *(undefined4 *)((long)ref_frame_config->reference + lVar9) = 1;
        }
        else if (layer_id->spatial_layer_id == 1) {
          lVar9 = 0x44;
          iVar7 = 0;
          iVar11 = 3;
          goto LAB_006254cc;
        }
        if (layer_id->spatial_layer_id < 1) goto LAB_006254e6;
      }
      else {
        if ((uVar3 ^ 1) != 0 || (uVar8 ^ 3) != 0) {
          if ((uVar3 ^ 3) == 0 && (uVar8 ^ 3) == 0) {
            if (simulcast_mode == 0) {
              ref_config_3SL3TL(ref_frame_config,layer_id,is_key_frame,this->superframe_cnt_);
              if ((multi_ref != 0) && (layer_id->spatial_layer_id == 2)) {
                ref_frame_config->ref_idx[6] = 7;
                if (is_key_frame == 0) {
                  ref_frame_config->reference[6] = 1;
                }
                uVar3 = iVar11 * -0x33333333 + 0x19999998;
                if (((uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0x19999999) &&
                   (layer_id->temporal_layer_id == 0)) {
                  ref_frame_config->refresh[7] = 1;
                }
              }
            }
            else {
              ref_config_simulcast3SL3TL
                        (ref_frame_config,layer_id,is_key_frame,this->superframe_cnt_);
            }
          }
          goto LAB_006254e6;
        }
        layer_id->temporal_layer_id = 0;
        iVar7 = layer_id->spatial_layer_id;
        if (iVar7 == 0) {
          ref_frame_config->ref_idx[3] = 0;
          ref_frame_config->ref_idx[4] = 0;
          ref_frame_config->ref_idx[5] = 0;
          ref_frame_config->ref_idx[6] = 0;
          piVar1[0] = 0;
          piVar1[1] = 0;
          piVar1[2] = 0;
          piVar1[3] = 0;
          lVar9 = 0x38;
LAB_0062560e:
          *(undefined4 *)((long)ref_frame_config->reference + lVar9) = 1;
        }
        else {
          if (iVar7 == 1) {
            ref_frame_config->ref_idx[3] = 0;
            ref_frame_config->ref_idx[4] = 0;
            ref_frame_config->ref_idx[5] = 0;
            ref_frame_config->ref_idx[6] = 0;
            piVar1[0] = 0;
            piVar1[1] = 0;
            piVar1[2] = 0;
            piVar1[3] = 0;
            ref_frame_config->ref_idx[0] = 1;
            lVar9 = 0x3c;
            if (use_last_as_scaled) {
              lVar6 = 0;
              auVar15 = _DAT_00c400f0;
              auVar19 = _DAT_00c40100;
              do {
                if (SUB164(auVar19 ^ auVar2,4) == -0x80000000 &&
                    SUB164(auVar19 ^ auVar2,0) < -0x7ffffff9) {
                  ref_frame_config->ref_idx[lVar6] = 1;
                  ref_frame_config->ref_idx[lVar6 + 1] = 1;
                }
                if (SUB164(auVar15 ^ auVar2,4) == -0x80000000 &&
                    SUB164(auVar15 ^ auVar2,0) < -0x7ffffff9) {
                  ref_frame_config->ref_idx[lVar6 + 2] = 1;
                  ref_frame_config->ref_idx[lVar6 + 3] = 1;
                }
                lVar6 = lVar6 + 4;
                lVar16 = auVar19._8_8_;
                auVar19._0_8_ = auVar19._0_8_ + 4;
                auVar19._8_8_ = lVar16 + 4;
                lVar16 = auVar15._8_8_;
                auVar15._0_8_ = auVar15._0_8_ + 4;
                auVar15._8_8_ = lVar16 + 4;
              } while (lVar6 != 8);
              ref_frame_config->ref_idx[0] = 0;
              ref_frame_config->ref_idx[3] = 1;
            }
            goto LAB_0062560e;
          }
          if (iVar7 == 2) {
            lVar9 = 0;
            auVar14 = _DAT_00c400f0;
            auVar18 = _DAT_00c40100;
            do {
              if (SUB164(auVar18 ^ auVar2,4) == -0x80000000 &&
                  SUB164(auVar18 ^ auVar2,0) < -0x7ffffff9) {
                ref_frame_config->ref_idx[lVar9] = 1;
                ref_frame_config->ref_idx[lVar9 + 1] = 1;
              }
              if (SUB164(auVar14 ^ auVar2,4) == -0x80000000 &&
                  SUB164(auVar14 ^ auVar2,0) < -0x7ffffff9) {
                ref_frame_config->ref_idx[lVar9 + 2] = 1;
                ref_frame_config->ref_idx[lVar9 + 3] = 1;
              }
              lVar9 = lVar9 + 4;
              lVar6 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 4;
              auVar18._8_8_ = lVar6 + 4;
              lVar6 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 4;
              auVar14._8_8_ = lVar6 + 4;
            } while (lVar9 != 8);
            ref_frame_config->ref_idx[0] = 2;
            ref_frame_config->refresh[2] = 1;
            if (multi_ref != 0) {
              ref_frame_config->ref_idx[6] = 7;
              ref_frame_config->reference[6] = 1;
              uVar3 = iVar11 * -0x33333333 + 0x19999998;
              if ((uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0x19999999) {
                lVar9 = 0x54;
                goto LAB_0062560e;
              }
            }
          }
        }
        if (layer_id->spatial_layer_id < 1) goto LAB_006254e6;
        if (use_last_as_scaled_single_ref) {
          ref_frame_config->reference[3] = 0;
          goto LAB_006254e6;
        }
      }
      ref_frame_config->reference[3] = 1;
      goto LAB_006254e6;
    }
    if (multi_ref == 0) {
      uVar4 = 0;
    }
    else {
      ref_frame_config->ref_idx[3] = 3;
      uVar3 = iVar11 % 4 + 4;
      uVar4 = (ulong)uVar3;
      ref_frame_config->ref_idx[6] = uVar3;
    }
    if ((frame_cnt & 3U) == 0) {
      layer_id->temporal_layer_id = 0;
      ref_frame_config->refresh[0] = 1;
      ref_frame_config->reference[3] = 1;
      if (multi_ref == 0) goto LAB_006254e6;
      uVar3 = iVar11 * -0x33333333 + 0x19999998;
      if ((uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0x19999999) {
        ref_frame_config->refresh[3] = 1;
      }
      ref_frame_config->refresh[uVar4] = 1;
    }
    else if ((frame_cnt - 1U & 3) == 0) {
      layer_id->temporal_layer_id = 2;
    }
    else if ((frame_cnt & 3U) == 2) {
      layer_id->temporal_layer_id = 1;
      ref_frame_config->refresh[1] = 1;
    }
    else if ((frame_cnt + 1U & 3) == 0) {
      layer_id->temporal_layer_id = 2;
      ref_frame_config->ref_idx[0] = 1;
      ref_frame_config->ref_idx[1] = 0;
    }
    if (multi_ref == 0) goto LAB_006254e6;
  }
  ref_frame_config->reference[3] = 1;
  ref_frame_config->reference[6] = 1;
LAB_006254e6:
  if ((dynamic_enable_disable_mode == 1) &&
     (layer_id->spatial_layer_id == this->number_spatial_layers_ + -1)) {
    ref_frame_config->reference[0] = 0;
  }
  return 0;
}

Assistant:

virtual int set_layer_pattern(
      int frame_cnt, aom_svc_layer_id_t *layer_id,
      aom_svc_ref_frame_config_t *ref_frame_config,
      aom_svc_ref_frame_comp_pred_t *ref_frame_comp_pred, int spatial_layer,
      int multi_ref, int comp_pred, int is_key_frame,
      int dynamic_enable_disable_mode, int rps_mode, int rps_recovery_frame,
      int simulcast_mode, bool use_last_as_scaled,
      bool use_last_as_scaled_single_ref) {
    int lag_index = 0;
    int base_count = frame_cnt >> 2;
    layer_id->spatial_layer_id = spatial_layer;
    // Set the reference map buffer idx for the 7 references:
    // LAST_FRAME (0), LAST2_FRAME(1), LAST3_FRAME(2), GOLDEN_FRAME(3),
    // BWDREF_FRAME(4), ALTREF2_FRAME(5), ALTREF_FRAME(6).
    for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      ref_frame_config->ref_idx[i] = i;
      ref_frame_config->reference[i] = 0;
    }
    for (int i = 0; i < REF_FRAMES; i++) ref_frame_config->refresh[i] = 0;
    if (comp_pred) {
      ref_frame_comp_pred->use_comp_pred[0] = 1;  // GOLDEN_LAST
      ref_frame_comp_pred->use_comp_pred[1] = 1;  // LAST2_LAST
      ref_frame_comp_pred->use_comp_pred[2] = 1;  // ALTREF_LAST
    }
    // Set layer_flags to 0 when using ref_frame_config->reference.
    int layer_flags = 0;
    // Always reference LAST.
    ref_frame_config->reference[0] = 1;
    if (number_temporal_layers_ == 1 && number_spatial_layers_ == 1) {
      layer_id->temporal_layer_id = 0;
      ref_frame_config->refresh[0] = 1;
      if (rps_mode)
        ref_config_rps(ref_frame_config, frame_cnt, rps_recovery_frame);
      if (intra_only_single_layer_) {
        // This repros the crash in Bug: 363016123.
        ref_frame_config->ref_idx[0] = 0;
        ref_frame_config->ref_idx[3] = 1;
        ref_frame_config->ref_idx[6] = 2;
        if (frame_cnt == 1) {
          for (int i = 0; i < INTER_REFS_PER_FRAME; i++)
            ref_frame_config->reference[i] = 0;
        }
      }
    }
    if (number_temporal_layers_ == 2 && number_spatial_layers_ == 1) {
      // 2-temporal layer.
      //    1    3    5
      //  0    2    4
      // Keep golden fixed at slot 3.
      base_count = frame_cnt >> 1;
      ref_frame_config->ref_idx[3] = 3;
      // Cyclically refresh slots 5, 6, 7, for lag alt ref.
      lag_index = 5;
      if (base_count > 0) {
        lag_index = 5 + (base_count % 3);
        if (frame_cnt % 2 != 0) lag_index = 5 + ((base_count + 1) % 3);
      }
      // Set the altref slot to lag_index.
      ref_frame_config->ref_idx[6] = lag_index;
      if (frame_cnt % 2 == 0) {
        layer_id->temporal_layer_id = 0;
        // Update LAST on layer 0, reference LAST.
        ref_frame_config->refresh[0] = 1;
        ref_frame_config->reference[0] = 1;
        // Refresh lag_index slot, needed for lagging golen.
        ref_frame_config->refresh[lag_index] = 1;
        // Refresh GOLDEN every x base layer frames.
        if (base_count % 32 == 0) ref_frame_config->refresh[3] = 1;
      } else {
        layer_id->temporal_layer_id = 1;
        // No updates on layer 1, reference LAST (TL0).
        ref_frame_config->reference[0] = 1;
      }
      // Always reference golden and altref on TL0.
      if (layer_id->temporal_layer_id == 0) {
        ref_frame_config->reference[3] = 1;
        ref_frame_config->reference[6] = 1;
      }
    } else if (number_temporal_layers_ == 3 && number_spatial_layers_ == 1) {
      // 3-layer:
      //   1    3   5    7
      //     2        6
      // 0        4        8
      if (multi_ref) {
        // Keep golden fixed at slot 3.
        ref_frame_config->ref_idx[3] = 3;
        // Cyclically refresh slots 4, 5, 6, 7, for lag altref.
        lag_index = 4 + (base_count % 4);
        // Set the altref slot to lag_index.
        ref_frame_config->ref_idx[6] = lag_index;
      }
      if (frame_cnt % 4 == 0) {
        // Base layer.
        layer_id->temporal_layer_id = 0;
        // Update LAST on layer 0, reference LAST and GF.
        ref_frame_config->refresh[0] = 1;
        ref_frame_config->reference[3] = 1;
        if (multi_ref) {
          // Refresh GOLDEN every x ~10 base layer frames.
          if (base_count % 10 == 0) ref_frame_config->refresh[3] = 1;
          // Refresh lag_index slot, needed for lagging altref.
          ref_frame_config->refresh[lag_index] = 1;
        }
      } else if ((frame_cnt - 1) % 4 == 0) {
        layer_id->temporal_layer_id = 2;
        // First top layer: no updates, only reference LAST (TL0).
      } else if ((frame_cnt - 2) % 4 == 0) {
        layer_id->temporal_layer_id = 1;
        // Middle layer (TL1): update LAST2, only reference LAST (TL0).
        ref_frame_config->refresh[1] = 1;
      } else if ((frame_cnt - 3) % 4 == 0) {
        layer_id->temporal_layer_id = 2;
        // Second top layer: no updates, only reference LAST.
        // Set buffer idx for LAST to slot 1, since that was the slot
        // updated in previous frame. So LAST is TL1 frame.
        ref_frame_config->ref_idx[0] = 1;
        ref_frame_config->ref_idx[1] = 0;
      }
      if (multi_ref) {
        // Every frame can reference GOLDEN AND ALTREF.
        ref_frame_config->reference[3] = 1;
        ref_frame_config->reference[6] = 1;
      }
    } else if (number_temporal_layers_ == 1 && number_spatial_layers_ == 2) {
      layer_id->temporal_layer_id = 0;
      if (layer_id->spatial_layer_id == 0) {
        // Reference LAST, update LAST. Keep LAST and GOLDEN in slots 0 and 3.
        ref_frame_config->ref_idx[0] = 0;
        ref_frame_config->ref_idx[3] = 3;
        ref_frame_config->refresh[0] = 1;
      } else if (layer_id->spatial_layer_id == 1) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 3
        // and GOLDEN to slot 0. Update slot 3 (LAST).
        ref_frame_config->ref_idx[0] = 3;
        ref_frame_config->ref_idx[3] = 0;
        ref_frame_config->refresh[3] = 1;
      }
      // Reference GOLDEN.
      if (layer_id->spatial_layer_id > 0) ref_frame_config->reference[3] = 1;
    } else if (number_temporal_layers_ == 1 && number_spatial_layers_ == 3) {
      // 3 spatial layers, 1 temporal.
      // Note for this case , we set the buffer idx for all references to be
      // either LAST or GOLDEN, which are always valid references, since decoder
      // will check if any of the 7 references is valid scale in
      // valid_ref_frame_size().
      layer_id->temporal_layer_id = 0;
      if (layer_id->spatial_layer_id == 0) {
        // Reference LAST, update LAST. Set all other buffer_idx to 0.
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 0;
        ref_frame_config->refresh[0] = 1;
      } else if (layer_id->spatial_layer_id == 1) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1
        // and GOLDEN (and all other refs) to slot 0.
        // Update slot 1 (LAST).
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 0;
        ref_frame_config->ref_idx[0] = 1;
        if (use_last_as_scaled) {
          for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 1;
          ref_frame_config->ref_idx[0] = 0;
          ref_frame_config->ref_idx[3] = 1;
        }
        ref_frame_config->refresh[1] = 1;
      } else if (layer_id->spatial_layer_id == 2) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2
        // and GOLDEN (and all other refs) to slot 1.
        // Update slot 2 (LAST).
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 1;
        ref_frame_config->ref_idx[0] = 2;
        ref_frame_config->refresh[2] = 1;
        if (multi_ref) {
          ref_frame_config->ref_idx[6] = 7;
          ref_frame_config->reference[6] = 1;
          if (base_count % 10 == 0) ref_frame_config->refresh[7] = 1;
        }
      }
      // Reference GOLDEN.
      if (layer_id->spatial_layer_id > 0) {
        if (use_last_as_scaled_single_ref)
          ref_frame_config->reference[3] = 0;
        else
          ref_frame_config->reference[3] = 1;
      }
    } else if (number_temporal_layers_ == 3 && number_spatial_layers_ == 3) {
      if (simulcast_mode) {
        ref_config_simulcast3SL3TL(ref_frame_config, layer_id, is_key_frame,
                                   superframe_cnt_);
      } else {
        ref_config_3SL3TL(ref_frame_config, layer_id, is_key_frame,
                          superframe_cnt_);
        // Allow for top spatial layer to use additional temporal reference.
        // Additional reference is only updated on base temporal layer, every
        // 10 TL0 frames here.
        if (multi_ref && layer_id->spatial_layer_id == 2) {
          ref_frame_config->ref_idx[6] = 7;
          if (!is_key_frame) ref_frame_config->reference[6] = 1;
          if (base_count % 10 == 0 && layer_id->temporal_layer_id == 0)
            ref_frame_config->refresh[7] = 1;
        }
      }
    }
    // If the top spatial layer is first-time encoded in mid-sequence
    // (i.e., dynamic_enable_disable_mode = 1), then don't predict from LAST,
    // since it will have been last updated on first key frame (SL0) and so
    // be different resolution from SL2.
    if (dynamic_enable_disable_mode == 1 &&
        layer_id->spatial_layer_id == number_spatial_layers_ - 1)
      ref_frame_config->reference[0] = 0;
    return layer_flags;
  }